

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_feature_merger.cc
# Opt level: O1

base_learner * VW::shared_feature_merger::shared_feature_merger_setup(options_i *options,vw *all)

{
  long lVar1;
  char cVar2;
  int iVar3;
  sfm_data *dat;
  base_learner *l;
  multi_learner *base;
  learner<VW::shared_feature_merger::sfm_data,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar4;
  long lVar5;
  bool bVar6;
  
  lVar1 = DAT_002da1e0;
  lVar5 = option_strings_abi_cxx11_;
  bVar6 = option_strings_abi_cxx11_ == DAT_002da1e0;
  if (bVar6) {
LAB_00217916:
    if (bVar6) {
      return (base_learner *)0x0;
    }
  }
  else {
    iVar3 = (*options->_vptr_options_i[1])(options,option_strings_abi_cxx11_);
    cVar2 = (char)iVar3;
    while (cVar2 == '\0') {
      lVar5 = lVar5 + 0x20;
      bVar6 = lVar5 == lVar1;
      if (bVar6) goto LAB_00217916;
      iVar3 = (*options->_vptr_options_i[1])(options,lVar5);
      cVar2 = (char)iVar3;
    }
  }
  dat = calloc_or_throw<VW::shared_feature_merger::sfm_data>(1);
  l = setup_base(options,all);
  base = LEARNER::as_multiline<char,char>(l);
  plVar4 = LEARNER::
           learner<VW::shared_feature_merger::sfm_data,std::vector<example*,std::allocator<example*>>>
           ::init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (dat,base,predict_or_learn<true>,predict_or_learn<false>,1,
                      *(prediction_type_t *)(base + 0xd0));
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* shared_feature_merger_setup(config::options_i& options, vw& all)
{
  if (!use_reduction(options))
    return nullptr;

  auto data = scoped_calloc_or_throw<sfm_data>();

  auto* base = LEARNER::as_multiline(setup_base(options, all));
  auto& learner = LEARNER::init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  // TODO: Incorrect feature numbers will be reported without merging the example namespaces from the
  //       shared example in a finish_example function. However, its too expensive to perform the full operation.

  return LEARNER::make_base(learner);
}